

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

double net_bw(char *iface,char *stage)

{
  char *__s1;
  int iVar1;
  size_t __n;
  char *in_RSI;
  char *in_RDI;
  bool bVar2;
  sensor_slurp proc_net;
  char *p;
  char *temp_if;
  int i;
  double net_bw;
  timeval t;
  long r_bytes;
  long s_bytes;
  char *in_stack_ffffffffffffdf90;
  undefined1 local_2060 [8200];
  char *local_58;
  char *local_50;
  int local_44;
  double local_40;
  timeval local_38;
  long local_28;
  long local_20;
  char *local_18;
  double local_8;
  
  local_44 = 0;
  local_18 = in_RSI;
  if (in_RDI == (char *)0x0) {
    local_50 = strdup("eth0");
  }
  else {
    local_50 = strdup(in_RDI);
  }
  memcpy(local_2060,&PTR_anon_var_dwarf_2aab8_0018eaf8,0x2008);
  local_58 = update_file((sensor_slurp *)0x150aa8);
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  while( true ) {
    __s1 = local_58;
    bVar2 = false;
    if (local_58 != (char *)0x0) {
      in_stack_ffffffffffffdf90 = local_50;
      __n = strlen(local_50);
      iVar1 = strncmp(__s1,in_stack_ffffffffffffdf90,__n);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_58 = skip_token(in_stack_ffffffffffffdf90);
    local_58 = skip_whitespace((char *)0x150b3f);
  }
  local_58 = skip_token(in_stack_ffffffffffffdf90);
  local_58 = skip_whitespace((char *)0x150b6e);
  local_28 = strtol(local_58,(char **)0x0,10);
  for (; local_44 < 8; local_44 = local_44 + 1) {
    local_58 = skip_token(in_stack_ffffffffffffdf90);
    local_58 = skip_whitespace((char *)0x150bc0);
  }
  local_20 = strtol(local_58,(char **)0x0,10);
  free(local_50);
  iVar1 = strncmp(local_18,"start",3);
  if (iVar1 == 0) {
    printf("Start %ld %ld \n",local_20,local_28);
    ::net_bw::old_s_bytes = local_20;
    ::net_bw::old_r_bytes = local_28;
    ::net_bw::start_time = local_38.tv_sec * 1000000 + local_38.tv_usec;
    local_8 = 0.0;
  }
  else {
    printf("End %ld %ld \n",local_20,local_28);
    ::net_bw::new_s_bytes = local_20;
    ::net_bw::new_r_bytes = local_28;
    ::net_bw::end_time = local_38.tv_sec * 1000000 + local_38.tv_usec;
    local_40 = ((double)((local_20 - ::net_bw::old_s_bytes) + (local_28 - ::net_bw::old_r_bytes)) /
               (double)(::net_bw::end_time - ::net_bw::start_time)) * 1000000.0 * 8.0;
    printf("Bandwidth = %f\n",local_40);
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

double net_bw(char *iface, char *stage)
{
	static long old_s_bytes, new_s_bytes, old_r_bytes, new_r_bytes, start_time, end_time;
	long s_bytes, r_bytes;
	struct timeval t;
	double net_bw;
#ifdef HAVE_MAC_SYSCTL
	char *buf = NULL, *lim, *next;
	static int mib[6];
  	size_t mlen,vlen;
	struct if_msghdr *ifm;
	unsigned int ifindex;
  	mib[0] = CTL_NET;
  	mib[1] = PF_ROUTE;
	mib[2] = 0;
	mib[3] = 0;
	mib[4] = NET_RT_IFLIST;
	mib[5] = 0;
	
	mlen = 6;
	ifindex = if_nametoindex(iface);
	sysctl(mib,mlen,NULL,&vlen,NULL,0);
	buf = malloc(vlen);
	sysctl(mib,mlen,buf,&vlen,NULL,0);
	lim = buf+vlen;
	for(next = buf; next < lim; )
	{	
		ifm = (struct if_msghdr *)next;
		next += ifm->ifm_msglen;
	//	printf("Index %d, ifm index %d\n",ifindex,ifm->ifm_index);
	//	printf("ibytes %ld\n",ifm->ifm_data.ifi_ibytes);
		if(ifindex == ifm->ifm_index)
		{
	//		printf("Correct interface\n");
			r_bytes = (long) ifm->ifm_data.ifi_ibytes;
			s_bytes = (long) ifm->ifm_data.ifi_obytes;
			break;
		}
	}
//	printf("Received bytes %ld Sent bytes %ld\n",r_bytes,s_bytes);
	free(buf);
	
#else

	int i=0;
	char *temp_if;
	char *p;

	if(iface == NULL)
		temp_if = strdup("eth0");
	else
		temp_if = strdup((const char*)iface);
	sensor_slurp proc_net = { "/proc/net/dev" };
        p = update_file(&proc_net);
#ifndef HAVE_WINDOWS_H
	gettimeofday(&t, NULL);
#else
	/* GSE...  No gettimeofday on windows.
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */

	struct _timeb nowb;
	_ftime(&nowb);
	t.tv_sec = (long)nowb.time;
	t.tv_usec = nowb.millitm * 1000;
#endif
        while (p && strncmp(p,temp_if,strlen(temp_if)))
        {
                p = skip_token(p);
                p = skip_whitespace(p);
        }
	
        p = skip_token(p);
        p = skip_whitespace(p);
        r_bytes = strtol( p ,NULL,10);
	while(i <= 7) {
                p = skip_token(p);
                p = skip_whitespace(p);
                ++i;
        }
	s_bytes = strtol (p, NULL,10);
	free(temp_if);
#endif // end HAVE_MAC_SYSCTL
	if(strncmp(stage,"start",3)==0)
	{
		printf("Start %ld %ld \n",s_bytes,r_bytes);
		
		old_s_bytes = s_bytes;
		old_r_bytes = r_bytes;
		start_time = t.tv_sec * 1000000 + t.tv_usec;

		return 0.0;
	}
	printf("End %ld %ld \n",s_bytes,r_bytes);
	new_s_bytes = s_bytes;
	new_r_bytes = r_bytes;
	end_time = t.tv_sec * 1000000 + t.tv_usec;
	net_bw = (double) (((new_s_bytes - old_s_bytes) + (new_r_bytes - old_r_bytes)) / (double)(end_time - start_time))*1000000*8;
	printf("Bandwidth = %f\n",net_bw);
	return net_bw;			
	
}